

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap.cpp
# Opt level: O0

Error * __thiscall
ot::commissioner::coap::Message::Serialize
          (Error *__return_storage_ptr__,Message *this,OptionType aOptionNumber,
          OptionValue *aOptionValue,uint16_t aLastOptionNumber,ByteArray *aBuf)

{
  char cVar1;
  ushort uVar2;
  vector<unsigned_char,std::allocator<unsigned_char>> *pvVar3;
  bool bVar4;
  byte bVar5;
  value_type vVar6;
  type tVar7;
  size_t sVar8;
  size_type sVar9;
  reference pvVar10;
  byte *pbVar11;
  ByteArray *pBVar12;
  const_iterator __first;
  const_iterator __last;
  v10 *this_00;
  basic_string_view<char> bVar13;
  format_args args;
  string_view fmt;
  short local_1d8;
  short local_1d4;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_180;
  const_iterator local_178;
  short local_16e;
  anon_class_1_0_00000001 local_16a;
  v10 local_169;
  uint16_t deltaLength;
  v10 *pvStack_168;
  char *local_160;
  string local_158;
  Error local_138;
  size_type local_110;
  size_t extend;
  size_t firstByte;
  ushort local_f0;
  ushort local_ee;
  ushort local_ec;
  undefined1 local_e9;
  uint16_t valueLength;
  uint16_t length;
  uint16_t delta;
  ByteArray *aBuf_local;
  v10 *pvStack_d8;
  uint16_t aLastOptionNumber_local;
  OptionValue *aOptionValue_local;
  Message *pMStack_c8;
  OptionType aOptionNumber_local;
  Message *this_local;
  Error *error;
  undefined1 local_a0 [16];
  v10 *local_90;
  char *local_88;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_ot::commissioner::coap::OptionType>
  *local_80;
  v10 *local_78;
  char *pcStack_70;
  string *local_68;
  v10 *local_60;
  undefined1 *local_58;
  v10 **local_50;
  v10 *local_48;
  char *pcStack_40;
  Error **local_38;
  undefined1 *local_30;
  Error **local_28;
  Error **local_20;
  undefined8 local_18;
  undefined1 *local_10;
  
  local_e9 = 0;
  _valueLength = (vector<unsigned_char,std::allocator<unsigned_char>> *)aBuf;
  aBuf_local._6_2_ = aLastOptionNumber;
  pvStack_d8 = (v10 *)aOptionValue;
  aOptionValue_local._6_2_ = aOptionNumber;
  pMStack_c8 = this;
  this_local = (Message *)__return_storage_ptr__;
  Error::Error(__return_storage_ptr__);
  tVar7 = utils::to_underlying<ot::commissioner::coap::OptionType>(aOptionValue_local._6_2_);
  local_ec = tVar7 - aBuf_local._6_2_;
  sVar8 = OptionValue::GetLength((OptionValue *)pvStack_d8);
  local_f0 = (ushort)sVar8;
  extend = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)_valueLength);
  local_110 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)_valueLength);
  local_110 = local_110 + 1;
  tVar7 = utils::to_underlying<ot::commissioner::coap::OptionType>(aOptionValue_local._6_2_);
  if (tVar7 < aBuf_local._6_2_) {
    abort();
  }
  this_00 = pvStack_d8;
  bVar4 = IsValidOption(aOptionValue_local._6_2_,(OptionValue *)pvStack_d8);
  pvVar3 = _valueLength;
  if (bVar4) {
    if (local_ec < 0xd) {
      local_1d4 = 0;
    }
    else {
      local_1d4 = 2;
      if (local_ec < 0xe) {
        local_1d4 = 1;
      }
    }
    if (local_f0 < 0xd) {
      local_1d8 = 0;
    }
    else {
      local_1d8 = 2;
      if (local_f0 < 0xe) {
        local_1d8 = 1;
      }
    }
    local_ee = local_1d4 + 1 + local_1d8;
    sVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)_valueLength);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)pvVar3,sVar9 + local_ee);
    if (local_ec < 0xd) {
      cVar1 = (char)local_ec;
      pvVar10 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)_valueLength,
                           extend);
      *pvVar10 = cVar1 << 4;
    }
    else if (local_ec < 0x10d) {
      pbVar11 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)_valueLength,
                           extend);
      sVar9 = local_110;
      *pbVar11 = *pbVar11 | 0xd0;
      cVar1 = (char)local_ec;
      local_110 = local_110 + 1;
      pvVar10 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)_valueLength,
                           sVar9);
      *pvVar10 = cVar1 + 0xf3;
    }
    else {
      pbVar11 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)_valueLength,
                           extend);
      sVar9 = local_110;
      *pbVar11 = *pbVar11 | 0xe0;
      local_ec = local_ec - 0x10d;
      uVar2 = local_ec >> 8;
      local_110 = local_110 + 1;
      pvVar10 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)_valueLength,
                           sVar9);
      sVar9 = local_110;
      *pvVar10 = (value_type)uVar2;
      vVar6 = (value_type)local_ec;
      local_110 = local_110 + 1;
      pvVar10 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)_valueLength,
                           sVar9);
      *pvVar10 = vVar6;
    }
    if (local_f0 < 0xd) {
      bVar5 = (byte)local_f0;
      pbVar11 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)_valueLength,
                           extend);
      *pbVar11 = *pbVar11 | bVar5;
    }
    else if (local_f0 < 0x10d) {
      pbVar11 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)_valueLength,
                           extend);
      sVar9 = local_110;
      *pbVar11 = *pbVar11 | 0xd;
      cVar1 = (char)local_f0;
      local_110 = local_110 + 1;
      pvVar10 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)_valueLength,
                           sVar9);
      *pvVar10 = cVar1 + 0xf3;
    }
    else {
      local_16e = local_f0 - 0x10d;
      pbVar11 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)_valueLength,
                           extend);
      sVar9 = local_110;
      *pbVar11 = *pbVar11 | 0xe;
      uVar2 = (ushort)local_16e >> 8;
      local_110 = local_110 + 1;
      pvVar10 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)_valueLength,
                           sVar9);
      sVar9 = local_110;
      *pvVar10 = (value_type)uVar2;
      vVar6 = (value_type)local_16e;
      local_110 = local_110 + 1;
      pvVar10 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)_valueLength,
                           sVar9);
      *pvVar10 = vVar6;
    }
    pvVar3 = _valueLength;
    if (local_ee + extend != local_110) {
      abort();
    }
    local_180._M_current =
         (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)_valueLength);
    __gnu_cxx::
    __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
    ::__normal_iterator<unsigned_char*>
              ((__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                *)&local_178,&local_180);
    pBVar12 = OptionValue::GetOpaqueValue((OptionValue *)pvStack_d8);
    __first = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(pBVar12);
    pBVar12 = OptionValue::GetOpaqueValue((OptionValue *)pvStack_d8);
    __last = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(pBVar12);
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
              (pvVar3,local_178,
               (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )__first._M_current,
               (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )__last._M_current);
  }
  else {
    Serialize::anon_class_1_0_00000001::operator()(&local_16a);
    local_58 = (undefined1 *)&stack0xfffffffffffffe98;
    local_60 = &local_169;
    bVar13 = ::fmt::v10::operator()(local_60);
    local_160 = (char *)bVar13.size_;
    pvStack_168 = (v10 *)bVar13.data_;
    ::fmt::v10::detail::
    check_format_string<ot::commissioner::coap::OptionType_&,_FMT_COMPILE_STRING,_0>();
    local_68 = &local_158;
    local_78 = pvStack_168;
    pcStack_70 = local_160;
    local_80 = (format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_ot::commissioner::coap::OptionType>
                *)((long)&aOptionValue_local + 6);
    local_50 = &local_78;
    local_90 = pvStack_168;
    local_88 = local_160;
    local_48 = local_90;
    pcStack_40 = local_88;
    error = (Error *)::fmt::v10::
                     make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,ot::commissioner::coap::OptionType>
                               (local_80,this_00,(OptionType *)local_68);
    local_30 = local_a0;
    local_38 = &error;
    local_18 = 0xf;
    args.field_1 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
                    )(anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
                      )aBuf;
    args.desc_ = (unsigned_long_long)local_38;
    fmt.size_ = 0xf;
    fmt.data_ = local_88;
    local_28 = local_38;
    local_20 = local_38;
    local_10 = local_30;
    ::fmt::v10::vformat_abi_cxx11_(&local_158,local_90,fmt,args);
    Error::Error(&local_138,kInvalidArgs,&local_158);
    Error::operator=(__return_storage_ptr__,&local_138);
    Error::~Error(&local_138);
    std::__cxx11::string::~string((string *)&local_158);
  }
  return __return_storage_ptr__;
}

Assistant:

Error Message::Serialize(OptionType         aOptionNumber,
                         const OptionValue &aOptionValue,
                         uint16_t           aLastOptionNumber,
                         ByteArray         &aBuf) const
{
    Error    error;
    uint16_t delta = utils::to_underlying(aOptionNumber) - aLastOptionNumber;
    uint16_t length;
    uint16_t valueLength = aOptionValue.GetLength();
    size_t   firstByte   = aBuf.size();
    size_t   extend      = aBuf.size() + 1;

    VerifyOrDie(utils::to_underlying(aOptionNumber) >= aLastOptionNumber);

    VerifyOrExit(IsValidOption(aOptionNumber, aOptionValue),
                 error = ERROR_INVALID_ARGS("option {} is not valid", aOptionNumber));

    length = 1;
    length += delta < kOption1ByteExtension ? 0 : (delta < kOption2ByteExtension ? 1 : 2);
    length += valueLength < kOption1ByteExtension ? 0 : (valueLength < kOption2ByteExtension ? 1 : 2);

    aBuf.resize(aBuf.size() + length);

    if (delta < kOption1ByteExtensionOffset)
    {
        aBuf[firstByte] = (delta << kOptionDeltaOffset) & kOptionDeltaMask;
    }
    else if (delta < kOption2ByteExtensionOffset)
    {
        aBuf[firstByte] |= kOption1ByteExtension << kOptionDeltaOffset;
        aBuf[extend++] = (delta - kOption1ByteExtensionOffset) & 0xff;
    }
    else
    {
        aBuf[firstByte] |= kOption2ByteExtension << kOptionDeltaOffset;
        delta -= kOption2ByteExtensionOffset;
        aBuf[extend++] = delta >> 8;
        aBuf[extend++] = delta & 0xff;
    }

    // Insert option length.
    if (valueLength < kOption1ByteExtensionOffset)
    {
        aBuf[firstByte] |= static_cast<uint8_t>(valueLength);
    }
    else if (valueLength < kOption2ByteExtensionOffset)
    {
        aBuf[firstByte] |= kOption1ByteExtension;
        aBuf[extend++] = (valueLength - kOption1ByteExtensionOffset) & 0xff;
    }
    else
    {
        uint16_t deltaLength = valueLength - kOption2ByteExtensionOffset;
        aBuf[firstByte] |= kOption2ByteExtension;
        aBuf[extend++] = deltaLength >> 8;
        aBuf[extend++] = deltaLength & 0xff;
    }

    VerifyOrDie(length + firstByte == extend);

    aBuf.insert(aBuf.end(), aOptionValue.GetOpaqueValue().begin(), aOptionValue.GetOpaqueValue().end());

exit:
    return error;
}